

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Fadds(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint fXorTrick;
  uint uVar5;
  uint fIgnoreBoxDelays;
  uint fVerbose;
  Gia_Man_t *pGVar6;
  Gia_Man_t *p;
  char *pcVar7;
  char *pcVar8;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_5c = 0x32;
  local_60 = 0x20;
  local_68 = 3;
  bVar2 = false;
  fVerbose = 0;
  local_6c = 0;
  local_64 = 3;
  local_58 = 0;
  fXorTrick = 0;
  fIgnoreBoxDelays = 0;
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"NBSLPnafxbvh"), iVar3 = globalUtilOptind,
          0x60 < iVar4) {
      if (iVar4 < 0x6e) {
        if (iVar4 == 0x61) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else if (iVar4 == 0x62) {
          fIgnoreBoxDelays = fIgnoreBoxDelays ^ 1;
        }
        else {
          if (iVar4 != 0x66) goto switchD_0028f505_caseD_4d;
          local_58 = local_58 ^ 1;
        }
      }
      else if (iVar4 == 0x6e) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      else if (iVar4 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      else {
        if (iVar4 != 0x78) goto switchD_0028f505_caseD_4d;
        fXorTrick = fXorTrick ^ 1;
      }
    }
    switch(iVar4) {
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-L\" should be followed by an integer.\n";
LAB_0028f696:
        Abc_Print(-1,pcVar7);
        goto switchD_0028f505_caseD_4d;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_60 = uVar5;
      break;
    case 0x4d:
    case 0x4f:
    case 0x51:
    case 0x52:
      goto switchD_0028f505_caseD_4d;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0028f696;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_68 = uVar5;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-P\" should be followed by an integer.\n";
        goto LAB_0028f696;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_5c = uVar5;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_0028f696;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_64 = uVar5;
      break;
    default:
      if (iVar4 != 0x42) {
        if (iVar4 == -1) {
          pGVar6 = pAbc->pGia;
          if (pGVar6 != (Gia_Man_t *)0x0) {
            if (bVar1) {
              pGVar6 = Gia_ManDupWithNaturalBoxes(pGVar6,local_68,fVerbose);
            }
            else {
              pGVar6 = Gia_ManDup(pGVar6);
              Gia_ManTransferTiming(pGVar6,pAbc->pGia);
            }
            if (bVar2) {
              p = Gia_ManDupWithArtificialBoxes
                            (pGVar6,local_6c,local_64,local_60,local_5c,local_58,fXorTrick,
                             fIgnoreBoxDelays,fVerbose);
            }
            else {
              p = Gia_ManDup(pGVar6);
              Gia_ManTransferTiming(p,pGVar6);
            }
            Gia_ManStop(pGVar6);
            Abc_FrameUpdateGia(pAbc,p);
            return 0;
          }
          Abc_Print(-1,"Abc_CommandAbc9Fadds(): There is no AIG.\n");
          return 0;
        }
        goto switchD_0028f505_caseD_4d;
      }
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-B\" should be followed by an integer.\n";
        goto LAB_0028f696;
      }
      uVar5 = atoi(argv[globalUtilOptind]);
      local_6c = uVar5;
    }
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)uVar5);
switchD_0028f505_caseD_4d:
  Abc_Print(-2,"usage: &fadds [-NBSLP num] [-nafxvh]\n");
  Abc_Print(-2,"\t         detects full-adder chains and puts them into white boxes\n");
  pcVar8 = "yes";
  pcVar7 = "yes";
  if (!bVar1) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-n     : toggles detecting natural full-adder chains [default = %s]\n",pcVar7);
  Abc_Print(-2,"\t-N num : minimum length of a natural full-adder chain to detect [default = %d]\n",
            (ulong)local_68);
  pcVar7 = "yes";
  if (!bVar2) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-a     : toggles detecting artificial full-adder chains [default = %s]\n",pcVar7);
  Abc_Print(-2,"\t-B num : full-adder box delay (percentage of AND-gate delay) [default = %d]\n",
            (ulong)local_6c);
  Abc_Print(-2,"\t-S num : minimum length of an artificial full-adder chain [default = %d]\n",
            (ulong)local_64);
  Abc_Print(-2,"\t-L num : maximum length of an artificial full-adder chain [default = %d]\n",
            (ulong)local_60);
  Abc_Print(-2,
            "\t-P num : maximum number of artificial full-adder chains to detect [default = %d]\n",
            (ulong)local_5c);
  pcVar7 = "yes";
  if (local_58 == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-f     : toggles allowing external fanouts in artificial chains [default = %s]\n",
            pcVar7);
  pcVar7 = "yes";
  if (fXorTrick == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,
            "\t-x     : toggles using XOR to generate fanouts in artificial chains [default = %s]\n"
            ,pcVar7);
  pcVar7 = "yes";
  if (fIgnoreBoxDelays == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-b     : toggles ignoring boxes when computing delays [default = %s]\n",pcVar7);
  if (fVerbose == 0) {
    pcVar8 = "no";
  }
  Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar8);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Fadds( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupWithNaturalBoxes( Gia_Man_t * p, int nFaddMin, int fVerbose );
    extern Gia_Man_t * Gia_ManDupWithArtificialBoxes( Gia_Man_t * p, int DelayC, int nPathMin, int nPathMax, int nPathLimit, int fUseFanout, int fXorTrick, int fIgnoreBoxDelays, int fVerbose );
    Gia_Man_t * pTemp, * pTemp2;
    int c, nFaddMin = 3, fUseNat = 0, fUseArt = 0, fVerbose = 0;
    int DelayC = 0, nPathMin = 3, nPathMax = 32, nPathLimit = 50, fUseFanout = 0, fUseXorTrick = 0, fIgnoreBoxDelays = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NBSLPnafxbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nFaddMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFaddMin < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            DelayC = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( DelayC < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            nPathMin = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPathMin < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nPathMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPathMax < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPathLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPathLimit < 0 )
                goto usage;
            break;
        case 'n':
            fUseNat ^= 1;
            break;
        case 'a':
            fUseArt ^= 1;
            break;
        case 'f':
            fUseFanout ^= 1;
            break;
        case 'x':
            fUseXorTrick ^= 1;
            break;
        case 'b':
            fIgnoreBoxDelays ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Fadds(): There is no AIG.\n" );
        return 0;
    }
    if ( fUseNat )
        pTemp = Gia_ManDupWithNaturalBoxes( pAbc->pGia, nFaddMin, fVerbose );
    else
    {
        pTemp = Gia_ManDup( pAbc->pGia );
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
    }
    if ( fUseArt )
        pTemp2 = Gia_ManDupWithArtificialBoxes( pTemp, DelayC, nPathMin, nPathMax, nPathLimit, fUseFanout, fUseXorTrick, fIgnoreBoxDelays, fVerbose );
    else
    {
        pTemp2 = Gia_ManDup( pTemp );
        Gia_ManTransferTiming( pTemp2, pTemp );
    }
    Gia_ManStop( pTemp );
    Abc_FrameUpdateGia( pAbc, pTemp2 );
    return 0;
usage:
    Abc_Print( -2, "usage: &fadds [-NBSLP num] [-nafxvh]\n" );
    Abc_Print( -2, "\t         detects full-adder chains and puts them into white boxes\n" );
    Abc_Print( -2, "\t-n     : toggles detecting natural full-adder chains [default = %s]\n",              fUseNat? "yes": "no" );
    Abc_Print( -2, "\t-N num : minimum length of a natural full-adder chain to detect [default = %d]\n",   nFaddMin );
    Abc_Print( -2, "\t-a     : toggles detecting artificial full-adder chains [default = %s]\n",           fUseArt? "yes": "no" );
    Abc_Print( -2, "\t-B num : full-adder box delay (percentage of AND-gate delay) [default = %d]\n",      DelayC );
    Abc_Print( -2, "\t-S num : minimum length of an artificial full-adder chain [default = %d]\n",         nPathMin );
    Abc_Print( -2, "\t-L num : maximum length of an artificial full-adder chain [default = %d]\n",         nPathMax );
    Abc_Print( -2, "\t-P num : maximum number of artificial full-adder chains to detect [default = %d]\n", nPathLimit );
    Abc_Print( -2, "\t-f     : toggles allowing external fanouts in artificial chains [default = %s]\n",   fUseFanout? "yes": "no" );
    Abc_Print( -2, "\t-x     : toggles using XOR to generate fanouts in artificial chains [default = %s]\n",   fUseXorTrick? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggles ignoring boxes when computing delays [default = %s]\n",             fIgnoreBoxDelays? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",                     fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}